

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateClassDefinition
          (MessageGenerator *this,Printer *printer)

{
  Options *val1;
  pointer *ppFVar1;
  ulong uVar2;
  uint uVar3;
  size_type sVar4;
  pointer pcVar5;
  string *value1;
  FileDescriptor *file;
  pointer pFVar6;
  bool bVar7;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar8;
  mapped_type *pmVar9;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *psVar10;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *psVar11;
  Descriptor *pDVar12;
  LogMessage *pLVar13;
  FieldGenerator *pFVar14;
  Options *pOVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar16;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  char *pcVar17;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *pFVar18;
  FieldDescriptor *__tmp;
  pointer pFVar19;
  ulong uVar20;
  FieldGroup *pFVar21;
  int j;
  long lVar22;
  long lVar23;
  __normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
  __i;
  ulong uVar24;
  ulong uVar25;
  pointer pFVar26;
  ulong uVar27;
  pointer *pppFVar28;
  FieldGroup field_group;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_1;
  LogFinisher local_e9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_8;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_4;
  
  if (0 < *(int *)(this->descriptor_ + 0x38)) {
    lVar22 = 0;
    do {
      psVar8 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar22);
      if (psVar8->ptr_ == (MessageGenerator *)0x0) {
        pcVar17 = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cxx::MessageGenerator]"
        ;
        goto LAB_001be884;
      }
      GenerateClassDefinition(psVar8->ptr_,printer);
      io::Printer::Print(printer,"\n");
      io::Printer::Print(printer,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print(printer,"\n");
      lVar22 = lVar22 + 1;
    } while (lVar22 < *(int *)(this->descriptor_ + 0x38));
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  field_group._0_8_ =
       &field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&field_group,"classname","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&field_group);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  iVar16 = extraout_EDX;
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
    iVar16 = extraout_EDX_00;
  }
  SimpleItoa_abi_cxx11_
            ((string *)&field_group,(protobuf *)(ulong)*(uint *)(this->descriptor_ + 0x2c),iVar16);
  ppFVar1 = &aligned_to_1.
             super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aligned_to_1,"field_count","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&aligned_to_1);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&field_group);
  if (aligned_to_1.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar1) {
    operator_delete(aligned_to_1.
                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(aligned_to_1.
                                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   preferred_location_ + 1));
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  val1 = &this->options_;
  sVar4 = (this->options_).dllexport_decl._M_string_length;
  field_group._0_8_ =
       &field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar4 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&field_group,"dllexport","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&field_group);
    pOVar15 = (Options *)0x22c413;
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x22c413);
    pDVar12 = extraout_RDX_01;
  }
  else {
    pcVar5 = (val1->dllexport_decl)._M_dataplus._M_p;
    pOVar15 = val1;
    std::__cxx11::string::_M_construct<char*>((string *)&field_group,pcVar5,pcVar5 + sVar4);
    std::__cxx11::string::append((char *)&field_group);
    aligned_to_1.
    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&aligned_to_1,"dllexport","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&aligned_to_1);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&field_group);
    pDVar12 = extraout_RDX;
    if (aligned_to_1.
        super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar1) {
      operator_delete(aligned_to_1.
                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&(aligned_to_1.
                                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     preferred_location_ + 1));
      pDVar12 = extraout_RDX_00;
    }
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
    pDVar12 = extraout_RDX_02;
  }
  SuperClassName_abi_cxx11_((string *)&field_group,(cxx *)this->descriptor_,pDVar12);
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppFVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aligned_to_1,"superclass","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&aligned_to_1);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&field_group);
  if (aligned_to_1.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppFVar1) {
    operator_delete(aligned_to_1.
                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(aligned_to_1.
                                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   preferred_location_ + 1));
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  io::Printer::Print(printer,&vars,
                     "class $dllexport$$classname$ : public $superclass$ {\n public:\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "$classname$();\nvirtual ~$classname$();\n\n$classname$(const $classname$& from);\n\ninline $classname$& operator=(const $classname$& from) {\n  CopyFrom(from);\n  return *this;\n}\n\n"
                    );
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n  return _unknown_fields_;\n}\n\ninline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n  return &_unknown_fields_;\n}\n\n"
                      );
    pOVar15 = *(Options **)(*(long *)(this->descriptor_ + 0x10) + 0x88);
    if ((*(int *)(pOVar15 + 2) != 3) &&
       (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x59) == '\0')) {
      io::Printer::Print(printer,&vars,
                         "static const ::google::protobuf::Descriptor* descriptor();\n");
    }
  }
  io::Printer::Print(printer,&vars,"static const $classname$& default_instance();\n\n");
  bVar7 = StaticInitializersForced(*(FileDescriptor **)(this->descriptor_ + 0x10));
  if (!bVar7) {
    io::Printer::Print(printer,&vars,
                       "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n// Returns the internal default instance pointer. This function can\n// return NULL thus should not be used by the user. This is intended\n// for Protobuf internal code. Please use default_instance() declared\n// above instead.\nstatic inline const $classname$* internal_default_instance() {\n  return default_instance_;\n}\n#endif\n\n"
                      );
  }
  io::Printer::Print(printer,&vars,
                     "void Swap($classname$* other);\n\n// implements Message ----------------------------------------------\n\n$classname$* New() const;\n"
                    );
  iVar16 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  if (iVar16 != 2) {
    if (iVar16 == 3) {
      pcVar17 = "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n";
    }
    else {
      pcVar17 = 
      "void CopyFrom(const ::google::protobuf::Message& from);\nvoid MergeFrom(const ::google::protobuf::Message& from);\n"
      ;
    }
    io::Printer::Print(printer,&vars,pcVar17);
    io::Printer::Print(printer,&vars,
                       "void CopyFrom(const $classname$& from);\nvoid MergeFrom(const $classname$& from);\nvoid Clear();\nbool IsInitialized() const;\n\nint ByteSize() const;\nbool MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input);\nvoid SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const;\n"
                      );
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 1) {
      io::Printer::Print(printer,
                         "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n"
                        );
    }
  }
  io::Printer::Print(printer,&vars,
                     "int GetCachedSize() const { return _cached_size_; }\nprivate:\nvoid SharedCtor();\nvoid SharedDtor();\nvoid SetCachedSize(int size) const;\npublic:\n\n"
                    );
  pcVar17 = "::google::protobuf::Metadata GetMetadata() const;\n\n";
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    pcVar17 = "::std::string GetTypeName() const;\n\n";
  }
  io::Printer::Print(printer,pcVar17);
  io::Printer::Print(printer,
                     "// xml support -----------------------------------------------------\n\n");
  io::Printer::Print(printer,&vars,
                     "// Parse a protocol buffer contained in a string.\nbool ParseFromXmlString(const std::string& data);\n// Like ParseFromXmlString(), but accepts messages that are missing\n// required fields.\nbool ParsePartialFromXmlString(const std::string& data);\n\n// Serialize the message and store it in the given string.  All required\n// fields must be set.\nbool SerializeToXmlString(std::string* output) const;\n// Like SerializeToXmlString(), but allows missing required fields.\nbool SerializePartialToXmlString(std::string* output) const;\n\n"
                    );
  io::Printer::Print(printer,
                     "// nested types ----------------------------------------------------\n\n");
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x38)) {
    lVar22 = 0;
    lVar23 = 0;
    do {
      value1 = *(string **)(*(long *)(pDVar12 + 0x40) + lVar22);
      ClassName_abi_cxx11_
                ((string *)&field_group,(cxx *)(*(long *)(pDVar12 + 0x40) + lVar22),
                 (Descriptor *)0x0,SUB81(pOVar15,0));
      io::Printer::Print(printer,"typedef $nested_full_name$ $nested_name$;\n","nested_name",value1,
                         "nested_full_name",(string *)&field_group);
      if ((pointer *)field_group._0_8_ !=
          &field_group.fields_.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)field_group._0_8_,
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 1);
      }
      lVar23 = lVar23 + 1;
      pDVar12 = this->descriptor_;
      pOVar15 = (Options *)(long)*(int *)(pDVar12 + 0x38);
      lVar22 = lVar22 + 0x78;
    } while (lVar23 < (long)pOVar15);
    if (0 < *(int *)(pDVar12 + 0x38)) {
      io::Printer::Print(printer,"\n");
      pDVar12 = this->descriptor_;
    }
  }
  if (0 < *(int *)(pDVar12 + 0x48)) {
    lVar22 = 0;
    do {
      psVar10 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
                ::operator[](&this->enum_generators_,lVar22);
      if (psVar10->ptr_ == (EnumGenerator *)0x0) {
        pcVar17 = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cxx::EnumGenerator]"
        ;
        goto LAB_001be884;
      }
      EnumGenerator::GenerateSymbolImports(psVar10->ptr_,printer);
      io::Printer::Print(printer,"\n");
      lVar22 = lVar22 + 1;
    } while (lVar22 < *(int *)(this->descriptor_ + 0x48));
  }
  io::Printer::Print(printer,
                     "// accessors -------------------------------------------------------\n\n");
  GenerateFieldAccessorDeclarations(this,printer);
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x68)) {
    lVar22 = 0;
    do {
      psVar11 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
                ::operator[](&this->extension_generators_,lVar22);
      if (psVar11->ptr_ == (ExtensionGenerator *)0x0) {
        pcVar17 = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::cxx::ExtensionGenerator]"
        ;
LAB_001be884:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,pcVar17);
      }
      ExtensionGenerator::GenerateDeclaration(psVar11->ptr_,printer);
      lVar22 = lVar22 + 1;
      pDVar12 = this->descriptor_;
    } while (lVar22 < *(int *)(pDVar12 + 0x68));
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)(pDVar12 + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," private:\n");
  io::Printer::Indent(printer);
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x2c)) {
    lVar22 = 0;
    lVar23 = 0;
    pFVar18 = extraout_RDX_03;
    do {
      if (*(int *)(*(long *)(pDVar12 + 0x30) + 0x30 + lVar22) != 3) {
        FieldName_abi_cxx11_
                  ((string *)&field_group,(cxx *)(*(long *)(pDVar12 + 0x30) + lVar22),pFVar18);
        io::Printer::Print(printer,"inline void set_has_$name$();\n","name",(string *)&field_group);
        pFVar18 = extraout_RDX_04;
        if ((pointer *)field_group._0_8_ !=
            &field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)field_group._0_8_,
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
          pFVar18 = extraout_RDX_05;
        }
        FieldName_abi_cxx11_
                  ((string *)&field_group,(cxx *)(*(long *)(this->descriptor_ + 0x30) + lVar22),
                   pFVar18);
        io::Printer::Print(printer,"inline void clear_has_$name$();\n","name",(string *)&field_group
                          );
        pFVar18 = extraout_RDX_06;
        if ((pointer *)field_group._0_8_ !=
            &field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)field_group._0_8_,
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
          pFVar18 = extraout_RDX_07;
        }
        pDVar12 = this->descriptor_;
      }
      lVar23 = lVar23 + 1;
      lVar22 = lVar22 + 0x78;
    } while (lVar23 < *(int *)(pDVar12 + 0x2c));
  }
  io::Printer::Print(printer,"\n");
  pDVar12 = this->descriptor_;
  if (0 < *(int *)(pDVar12 + 0x58)) {
    io::Printer::Print(printer,"::google::protobuf::internal::ExtensionSet _extensions_;\n\n");
    pDVar12 = this->descriptor_;
  }
  if (*(int *)(*(long *)(*(long *)(pDVar12 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"::google::protobuf::UnknownFieldSet _unknown_fields_;\n\n");
    pDVar12 = this->descriptor_;
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < *(int *)(pDVar12 + 0x2c)) {
    lVar22 = 0;
    lVar23 = 0;
    do {
      field_group._0_8_ = *(long *)(pDVar12 + 0x30) + lVar22;
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&fields,(FieldDescriptor **)&field_group);
      lVar23 = lVar23 + 1;
      pDVar12 = this->descriptor_;
      lVar22 = lVar22 + 0x78;
    } while (lVar23 < *(int *)(pDVar12 + 0x2c));
  }
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar27 = 0;
    do {
      pFVar18 = fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar27];
      if (pFVar18 == (FieldDescriptor *)0x0) {
LAB_001be2e1:
        internal::LogMessage::LogMessage
                  ((LogMessage *)&field_group,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_message.cc"
                   ,0xf4);
        pLVar13 = internal::LogMessage::operator<<
                            ((LogMessage *)&field_group,"Unknown alignment size.");
        internal::LogFinisher::operator=(&local_e9,pLVar13);
        internal::LogMessage::~LogMessage((LogMessage *)&field_group);
      }
      else {
        iVar16 = (int)uVar27;
        if (*(int *)(pFVar18 + 0x30) == 3) {
LAB_001be20b:
          field_group.preferred_location_ = (float)iVar16;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               field_group.fields_.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
          *field_group.fields_.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_start = pFVar18;
          field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               field_group.fields_.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          std::
          vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
          ::push_back(&aligned_to_8,&field_group);
        }
        else {
          uVar3 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                           (ulong)*(uint *)(pFVar18 + 0x2c) * 4);
          if (10 < uVar3) {
LAB_001be2aa:
            internal::LogMessage::LogMessage
                      ((LogMessage *)&field_group,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_message.cc"
                       ,0xb4);
            pLVar13 = internal::LogMessage::operator<<
                                ((LogMessage *)&field_group,"Can\'t get here.");
            internal::LogFinisher::operator=(&local_e9,pLVar13);
            internal::LogMessage::~LogMessage((LogMessage *)&field_group);
            goto LAB_001be2e1;
          }
          if ((0x634U >> (uVar3 & 0x1f) & 1) != 0) goto LAB_001be20b;
          if ((0x14aU >> (uVar3 & 0x1f) & 1) == 0) {
            if (uVar3 != 7) goto LAB_001be2aa;
            field_group.preferred_location_ = (float)iVar16;
            field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
            field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 field_group.fields_.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
            *field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start = pFVar18;
            field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 field_group.fields_.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            std::
            vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ::push_back(&aligned_to_1,&field_group);
          }
          else {
            field_group.preferred_location_ = (float)iVar16;
            field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
            field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 field_group.fields_.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
            *field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start = pFVar18;
            field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 field_group.fields_.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            std::
            vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ::push_back(&aligned_to_4,&field_group);
          }
        }
        if (field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < (ulong)((long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    if ((long)aligned_to_1.
              super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)aligned_to_1.
              super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar24 = (long)aligned_to_1.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)aligned_to_1.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      pFVar19 = aligned_to_1.
                super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar27 = 0;
      do {
        field_group._0_8_ = field_group._0_8_ & 0xffffffff00000000;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar2 = uVar27 + 4;
        if (uVar27 < uVar24) {
          pFVar21 = pFVar19;
          uVar25 = uVar2;
          if (uVar24 < uVar2) {
            uVar25 = uVar24;
          }
          do {
            anon_unknown_0::FieldGroup::Append(&field_group,pFVar21);
            uVar27 = uVar27 + 1;
            pFVar21 = pFVar21 + 1;
          } while (uVar27 < uVar25);
        }
        std::
        vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
        ::push_back(&aligned_to_4,&field_group);
        if (field_group.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)field_group.fields_.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pFVar19 = pFVar19 + 4;
        uVar27 = uVar2;
      } while (uVar2 < uVar24);
    }
  }
  pFVar6 = aligned_to_4.
           super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar19 = aligned_to_4.
            super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (aligned_to_4.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      aligned_to_4.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar23 = (long)aligned_to_4.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)aligned_to_4.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar27 = lVar23 >> 5;
    lVar22 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (aligned_to_4.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_start,
               aligned_to_4.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar23 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar6);
    }
    else {
      pFVar26 = pFVar19 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar26);
      for (; pFVar26 != pFVar6; pFVar26 = pFVar26 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (pFVar26);
      }
    }
    uVar24 = 0;
    do {
      field_group._0_8_ = field_group._0_8_ & 0xffffffff00000000;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar2 = uVar24 + 2;
      if (uVar24 < uVar27) {
        pFVar21 = pFVar19;
        uVar25 = uVar24;
        uVar20 = uVar2;
        if (uVar27 < uVar2) {
          uVar20 = uVar27;
        }
        do {
          anon_unknown_0::FieldGroup::Append(&field_group,pFVar21);
          uVar25 = uVar25 + 1;
          pFVar21 = pFVar21 + 1;
        } while (uVar25 < uVar20);
      }
      if (uVar27 - 1 == uVar24) {
        field_group.preferred_location_ =
             (float)(((long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
      }
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::push_back(&aligned_to_8,&field_group);
      if (field_group.fields_.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(field_group.fields_.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)field_group.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pFVar19 = pFVar19 + 2;
      uVar24 = uVar2;
    } while (uVar2 < uVar27);
  }
  pFVar6 = aligned_to_8.
           super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar19 = aligned_to_8.
            super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (aligned_to_8.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      aligned_to_8.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar23 = (long)aligned_to_8.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)aligned_to_8.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar27 = lVar23 >> 5;
    lVar22 = 0x3f;
    if (uVar27 != 0) {
      for (; uVar27 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (aligned_to_8.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_start,
               aligned_to_8.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar23 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar6);
    }
    else {
      pFVar26 = pFVar19 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pFVar19,pFVar26);
      for (; pFVar26 != pFVar6; pFVar26 = pFVar26 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (pFVar26);
      }
    }
  }
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         fields.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pFVar19 != pFVar6) {
    lVar22 = (long)pFVar6 - (long)pFVar19 >> 5;
    lVar22 = lVar22 + (ulong)(lVar22 == 0);
    pppFVar28 = &(pFVar19->fields_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    do {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&fields,
                 fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 ((_Vector_impl_data *)(pppFVar28 + -1))->_M_start,*pppFVar28);
      pppFVar28 = pppFVar28 + 4;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector(&aligned_to_8);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector(&aligned_to_4);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector(&aligned_to_1);
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar27 = 0;
    do {
      pFVar14 = FieldGeneratorMap::get
                          (&this->field_generators_,
                           fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar27]);
      (*pFVar14->_vptr_FieldGenerator[2])(pFVar14,printer);
      uVar27 = uVar27 + 1;
    } while (uVar27 < (ulong)((long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  io::Printer::Print(printer,"\nmutable int _cached_size_;\n");
  if (*(int *)(this->descriptor_ + 0x2c) < 1) {
    io::Printer::Print(printer,"::google::protobuf::uint32 _has_bits_[1];\n\n");
  }
  else {
    io::Printer::Print(printer,&vars,
                       "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n\n");
  }
  file = *(FileDescriptor **)(this->descriptor_ + 0x10);
  GlobalAddDescriptorsName((string *)&field_group,*(string **)file);
  PrintHandlingOptionalStaticInitializers
            (file,printer,"friend void $dllexport_decl$ $adddescriptorsname$();\n",
             "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n","dllexport_decl",
             &val1->dllexport_decl,"adddescriptorsname",(string *)&field_group);
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  GlobalAssignDescriptorsName
            ((string *)&field_group,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  GlobalShutdownFileName
            ((string *)&aligned_to_1,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
  io::Printer::Print(printer,
                     "friend void $assigndescriptorsname$();\nfriend void $shutdownfilename$();\n\n"
                     ,"assigndescriptorsname",(string *)&field_group,"shutdownfilename",
                     (string *)&aligned_to_1);
  if (aligned_to_1.
      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&aligned_to_1.
                super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(aligned_to_1.
                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(aligned_to_1.
                                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   preferred_location_ + 1));
  }
  if ((pointer *)field_group._0_8_ !=
      &field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)field_group._0_8_,
                    (long)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  io::Printer::Print(printer,
                     "void InitAsDefaultInstance();\nstatic $classname$* default_instance_;\n",
                     "classname",&this->classname_);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&vars,"};");
  if (fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::
GenerateClassDefinition(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateClassDefinition(printer);
    printer->Print("\n");
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  map<string, string> vars;
  vars["classname"] = classname_;
  vars["field_count"] = SimpleItoa(descriptor_->field_count());
  if (options_.dllexport_decl.empty()) {
    vars["dllexport"] = "";
  } else {
    vars["dllexport"] = options_.dllexport_decl + " ";
  }
  vars["superclass"] = SuperClassName(descriptor_);

  printer->Print(vars,
    "class $dllexport$$classname$ : public $superclass$ {\n"
    " public:\n");
  printer->Indent();

  printer->Print(vars,
    "$classname$();\n"
    "virtual ~$classname$();\n"
    "\n"
    "$classname$(const $classname$& from);\n"
    "\n"
    "inline $classname$& operator=(const $classname$& from) {\n"
    "  CopyFrom(from);\n"
    "  return *this;\n"
    "}\n"
    "\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n"
      "  return _unknown_fields_;\n"
      "}\n"
      "\n"
      "inline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n"
      "  return &_unknown_fields_;\n"
      "}\n"
      "\n");
  }

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file()) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(vars,
      "static const ::google::protobuf::Descriptor* descriptor();\n");
  }

  printer->Print(vars,
    "static const $classname$& default_instance();\n"
    "\n");

  if (!StaticInitializersForced(descriptor_->file())) {
    printer->Print(vars,
      "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
      "// Returns the internal default instance pointer. This function can\n"
      "// return NULL thus should not be used by the user. This is intended\n"
      "// for Protobuf internal code. Please use default_instance() declared\n"
      "// above instead.\n"
      "static inline const $classname$* internal_default_instance() {\n"
      "  return default_instance_;\n"
      "}\n"
      "#endif\n"
      "\n");
  }


  printer->Print(vars,
    "void Swap($classname$* other);\n"
    "\n"
    "// implements Message ----------------------------------------------\n"
    "\n"
    "$classname$* New() const;\n");

  if (HasGeneratedMethods(descriptor_->file())) {
    if (HasDescriptorMethods(descriptor_->file())) {
      printer->Print(vars,
        "void CopyFrom(const ::google::protobuf::Message& from);\n"
        "void MergeFrom(const ::google::protobuf::Message& from);\n");
    } else {
      printer->Print(vars,
        "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n");
    }

    printer->Print(vars,
      "void CopyFrom(const $classname$& from);\n"
      "void MergeFrom(const $classname$& from);\n"
      "void Clear();\n"
      "bool IsInitialized() const;\n"
      "\n"
      "int ByteSize() const;\n"
      "bool MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input);\n"
      "void SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const;\n");
    if (HasFastArraySerialization(descriptor_->file())) {
      printer->Print(
        "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n");
    }
  }

  printer->Print(vars,
    "int GetCachedSize() const { return _cached_size_; }\n"
    "private:\n"
    "void SharedCtor();\n"
    "void SharedDtor();\n"
    "void SetCachedSize(int size) const;\n"
    "public:\n"
    "\n");

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::Metadata GetMetadata() const;\n"
      "\n");
  } else {
    printer->Print(
      "::std::string GetTypeName() const;\n"
      "\n");
  }

  printer->Print(
    "// xml support -----------------------------------------------------\n"
    "\n");

  printer->Print(vars,
    "// Parse a protocol buffer contained in a string.\n"
    "bool ParseFromXmlString(const std::string& data);\n"
    "// Like ParseFromXmlString(), but accepts messages that are missing\n"
    "// required fields.\n"
    "bool ParsePartialFromXmlString(const std::string& data);\n"
    "\n"
    "// Serialize the message and store it in the given string.  All required\n"
    "// fields must be set.\n"
    "bool SerializeToXmlString(std::string* output) const;\n"
    "// Like SerializeToXmlString(), but allows missing required fields.\n"
    "bool SerializePartialToXmlString(std::string* output) const;\n"
    "\n");

  printer->Print(
    "// nested types ----------------------------------------------------\n"
    "\n");

  // Import all nested message classes into this class's scope with typedefs.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    const Descriptor* nested_type = descriptor_->nested_type(i);
    printer->Print("typedef $nested_full_name$ $nested_name$;\n",
                   "nested_name", nested_type->name(),
                   "nested_full_name", ClassName(nested_type, false));
  }

  if (descriptor_->nested_type_count() > 0) {
    printer->Print("\n");
  }

  // Import all nested enums and their values into this class's scope with
  // typedefs and constants.
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateSymbolImports(printer);
    printer->Print("\n");
  }

  printer->Print(
    "// accessors -------------------------------------------------------\n"
    "\n");

  // Generate accessor methods for all fields.
  GenerateFieldAccessorDeclarations(printer);

  // Declare extension identifiers.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateDeclaration(printer);
  }


  printer->Print(
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  // Generate private members.
  printer->Outdent();
  printer->Print(" private:\n");
  printer->Indent();


  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->is_repeated()) {
      printer->Print(
        "inline void set_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
      printer->Print(
        "inline void clear_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
    }
  }
  printer->Print("\n");

  // To minimize padding, data members are divided into three sections:
  // (1) members assumed to align to 8 bytes
  // (2) members corresponding to message fields, re-ordered to optimize
  //     alignment.
  // (3) members assumed to align to 4 bytes.

  // Members assumed to align to 8 bytes:

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "::google::protobuf::internal::ExtensionSet _extensions_;\n"
      "\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::UnknownFieldSet _unknown_fields_;\n"
      "\n");
  }

  // Field members:

  vector<const FieldDescriptor*> fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    fields.push_back(descriptor_->field(i));
  }
  OptimizePadding(&fields);
  for (int i = 0; i < fields.size(); ++i) {
    field_generators_.get(fields[i]).GeneratePrivateMembers(printer);
  }

  // Members assumed to align to 4 bytes:

  // TODO(kenton):  Make _cached_size_ an atomic<int> when C++ supports it.
  printer->Print(
      "\n"
      "mutable int _cached_size_;\n");

  // Generate _has_bits_.
  if (descriptor_->field_count() > 0) {
    printer->Print(vars,
      "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n"
      "\n");
  } else {
    // Zero-size arrays aren't technically allowed, and MSVC in particular
    // doesn't like them.  We still need to declare these arrays to make
    // other code compile.  Since this is an uncommon case, we'll just declare
    // them with size 1 and waste some space.  Oh well.
    printer->Print(
      "::google::protobuf::uint32 _has_bits_[1];\n"
      "\n");
  }

  // Declare AddDescriptors(), BuildDescriptors(), and ShutdownFile() as
  // friends so that they can access private static variables like
  // default_instance_ and reflection_.
  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "friend void $dllexport_decl$ $adddescriptorsname$();\n",
    // Without.
    "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n",
    // Vars.
    "dllexport_decl", options_.dllexport_decl,
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));

  printer->Print(
    "friend void $assigndescriptorsname$();\n"
    "friend void $shutdownfilename$();\n"
    "\n",
    "assigndescriptorsname",
      GlobalAssignDescriptorsName(descriptor_->file()->name()),
    "shutdownfilename", GlobalShutdownFileName(descriptor_->file()->name()));

  printer->Print(
    "void InitAsDefaultInstance();\n"
    "static $classname$* default_instance_;\n",
    "classname", classname_);

  printer->Outdent();
  printer->Print(vars, "};");
}